

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_idea.c
# Opt level: O0

int idea_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  IDEA_KEY_SCHEDULE *ks;
  int in_ECX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  IDEA_KEY_SCHEDULE tmp;
  undefined1 local_f4 [12];
  IDEA_KEY_SCHEDULE *in_stack_ffffffffffffff18;
  IDEA_KEY_SCHEDULE *in_stack_ffffffffffffff20;
  int local_1c;
  
  local_1c = in_ECX;
  if (in_ECX == 0) {
    EVP_CIPHER_CTX_get0_cipher(in_RDI);
    iVar1 = EVP_CIPHER_get_mode((EVP_CIPHER *)0x42a485);
    if (iVar1 == 4) {
      local_1c = 1;
    }
    else {
      EVP_CIPHER_CTX_get0_cipher(in_RDI);
      iVar1 = EVP_CIPHER_get_mode((EVP_CIPHER *)0x42a4ac);
      if (iVar1 == 3) {
        local_1c = 1;
      }
    }
  }
  if (local_1c == 0) {
    IDEA_set_encrypt_key(in_RSI,(IDEA_KEY_SCHEDULE *)local_f4);
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    IDEA_set_decrypt_key(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    OPENSSL_cleanse(local_f4,0xd8);
  }
  else {
    ks = (IDEA_KEY_SCHEDULE *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    IDEA_set_encrypt_key(in_RSI,ks);
  }
  return 1;
}

Assistant:

static int idea_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                         const unsigned char *iv, int enc)
{
    if (!enc) {
        if (EVP_CIPHER_CTX_get_mode(ctx) == EVP_CIPH_OFB_MODE)
            enc = 1;
        else if (EVP_CIPHER_CTX_get_mode(ctx) == EVP_CIPH_CFB_MODE)
            enc = 1;
    }
    if (enc)
        IDEA_set_encrypt_key(key, &EVP_C_DATA(EVP_IDEA_KEY,ctx)->ks);
    else {
        IDEA_KEY_SCHEDULE tmp;

        IDEA_set_encrypt_key(key, &tmp);
        IDEA_set_decrypt_key(&tmp, &EVP_C_DATA(EVP_IDEA_KEY,ctx)->ks);
        OPENSSL_cleanse((unsigned char *)&tmp, sizeof(IDEA_KEY_SCHEDULE));
    }
    return 1;
}